

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

bool __thiscall Lexer::ReadEvalString(Lexer *this,EvalString *eval,bool path,string *err)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  Lexer *this_00;
  byte *pbVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  byte *pbVar8;
  StringPiece text;
  StringPiece text_00;
  StringPiece text_01;
  StringPiece text_02;
  allocator<char> local_61;
  Lexer *local_60;
  string *local_58;
  string local_50;
  
  pbVar8 = (byte *)this->ofs_;
  local_60 = this;
  local_58 = err;
LAB_00177222:
  do {
    while (this_00 = local_60, bVar2 = *pbVar8, (""[bVar2] & 0x10) != 0) {
      sVar6 = 0;
      do {
        lVar3 = sVar6 + 1;
        sVar6 = sVar6 + 1;
      } while ((""[pbVar8[lVar3]] & 0x10) != 0);
      text.len_ = sVar6;
      text.str_ = (char *)pbVar8;
      EvalString::AddText(eval,text);
      pbVar8 = pbVar8 + sVar6;
    }
    if (bVar2 < 0xe) {
      if (bVar2 == 0) {
        local_60->last_token_ = (char *)pbVar8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"unexpected EOF",&local_61);
        Error(this_00,&local_50,local_58);
        goto LAB_00177491;
      }
      if (10 < bVar2) {
        if (pbVar8[1] != 10) {
          local_60->last_token_ = (char *)pbVar8;
          DescribeLastError_abi_cxx11_(&local_50,local_60);
          Error(this_00,&local_50,local_58);
          goto LAB_00177491;
        }
        local_60->last_token_ = (char *)pbVar8;
        local_60->ofs_ = (char *)(pbVar8 + (ulong)!path * 2);
        if (!path) {
          return true;
        }
        goto LAB_001773bc;
      }
    }
    else if ((byte)(bVar2 - 0x21) < 4) {
      pbVar4 = pbVar8 + 1;
      bVar2 = pbVar8[1];
      if ((""[bVar2] & 0x40) != 0) {
        sVar6 = 0;
        pbVar8 = pbVar4;
        do {
          pbVar1 = pbVar8 + 1;
          pbVar8 = pbVar8 + 1;
          sVar6 = sVar6 + 1;
        } while ((""[*pbVar1] & 0x40) != 0);
LAB_001772e2:
        text_01.len_ = sVar6;
        text_01.str_ = (char *)pbVar4;
        EvalString::AddSpecial(eval,text_01);
        goto LAB_00177222;
      }
      if (0x20 < bVar2) {
        if (bVar2 < 0x30) {
          if (bVar2 != 0x24) goto LAB_00177460;
          pcVar7 = "$";
        }
        else {
          if (0x3a < bVar2) {
            if (((byte)(bVar2 + 0x9f) < 0x1b) && ((char)""[pbVar8[2]] < '\0')) {
              pbVar4 = pbVar8 + 2;
              sVar6 = 0;
              do {
                sVar5 = sVar6;
                sVar6 = sVar5 + 1;
              } while ((char)""[pbVar8[sVar5 + 3]] < '\0');
              if (pbVar8[sVar5 + 3] == 0x7d) {
                pbVar8 = pbVar8 + sVar5 + 4;
                goto LAB_001772e2;
              }
            }
            goto LAB_00177460;
          }
          pcVar7 = ":";
        }
LAB_0017733c:
        pbVar8 = pbVar8 + 2;
        text_02.len_ = 1;
        text_02.str_ = pcVar7;
        EvalString::AddText(eval,text_02);
        goto LAB_00177222;
      }
      if (bVar2 < 0xd) {
        if (bVar2 == 10) {
          do {
            pbVar8 = pbVar4 + 1;
            pbVar1 = pbVar4 + 1;
            pbVar4 = pbVar8;
          } while (*pbVar1 == 0x20);
          goto LAB_00177222;
        }
      }
      else if (bVar2 == 0xd) {
        if (pbVar8[2] == 10) {
          pbVar4 = pbVar8 + 2;
          do {
            pbVar8 = pbVar4 + 1;
            pbVar1 = pbVar4 + 1;
            pbVar4 = pbVar8;
          } while (*pbVar1 == 0x20);
          goto LAB_00177222;
        }
      }
      else if (bVar2 == 0x20) {
        pcVar7 = " ";
        goto LAB_0017733c;
      }
LAB_00177460:
      local_60->last_token_ = (char *)pbVar8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"bad $-escape (literal $ must be written as $$)",&local_61);
      Error(this_00,&local_50,local_58);
LAB_00177491:
      std::__cxx11::string::~string((string *)&local_50);
      return false;
    }
    if (path) {
      local_60->last_token_ = (char *)pbVar8;
      local_60->ofs_ = (char *)pbVar8;
LAB_001773bc:
      EatWhitespace(local_60);
      return true;
    }
    if (bVar2 == 10) {
      local_60->last_token_ = (char *)pbVar8;
      local_60->ofs_ = (char *)(pbVar8 + 1);
      return true;
    }
    text_00.len_ = 1;
    text_00.str_ = (char *)pbVar8;
    EvalString::AddText(eval,text_00);
    pbVar8 = pbVar8 + 1;
  } while( true );
}

Assistant:

bool Lexer::ReadEvalString(EvalString* eval, bool path, string* err) {
  const char* p = ofs_;
  const char* q;
  const char* start;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,   0,  16,  16,   0,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 32,  16,  16,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16, 208, 144,  16, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208,   0,  16,  16,  16,  16,  16, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,  16,  16,  16, 208, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
	};
	yych = *p;
	if (yybm[0+yych] & 16) {
		goto yy100;
	}
	if (yych <= '\r') {
		if (yych <= 0x00) goto yy98;
		if (yych <= '\n') goto yy103;
		goto yy105;
	} else {
		if (yych <= ' ') goto yy103;
		if (yych <= '$') goto yy107;
		goto yy103;
	}
yy98:
	++p;
	{
      last_token_ = start;
      return Error("unexpected EOF", err);
    }
yy100:
	yych = *++p;
	if (yybm[0+yych] & 16) {
		goto yy100;
	}
	{
      eval->AddText(StringPiece(start, p - start));
      continue;
    }
yy103:
	++p;
	{
      if (path) {
        p = start;
        break;
      } else {
        if (*start == '\n')
          break;
        eval->AddText(StringPiece(start, 1));
        continue;
      }
    }
yy105:
	yych = *++p;
	if (yych == '\n') goto yy108;
	{
      last_token_ = start;
      return Error(DescribeLastError(), err);
    }
yy107:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy120;
	}
	if (yych <= ' ') {
		if (yych <= '\f') {
			if (yych == '\n') goto yy112;
			goto yy110;
		} else {
			if (yych <= '\r') goto yy115;
			if (yych <= 0x1F) goto yy110;
			goto yy116;
		}
	} else {
		if (yych <= '/') {
			if (yych == '$') goto yy118;
			goto yy110;
		} else {
			if (yych <= ':') goto yy123;
			if (yych <= '`') goto yy110;
			if (yych <= '{') goto yy125;
			goto yy110;
		}
	}
yy108:
	++p;
	{
      if (path)
        p = start;
      break;
    }
yy110:
	++p;
yy111:
	{
      last_token_ = start;
      return Error("bad $-escape (literal $ must be written as $$)", err);
    }
yy112:
	yych = *++p;
	if (yybm[0+yych] & 32) {
		goto yy112;
	}
	{
      continue;
    }
yy115:
	yych = *++p;
	if (yych == '\n') goto yy126;
	goto yy111;
yy116:
	++p;
	{
      eval->AddText(StringPiece(" ", 1));
      continue;
    }
yy118:
	++p;
	{
      eval->AddText(StringPiece("$", 1));
      continue;
    }
yy120:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy120;
	}
	{
      eval->AddSpecial(StringPiece(start + 1, p - start - 1));
      continue;
    }
yy123:
	++p;
	{
      eval->AddText(StringPiece(":", 1));
      continue;
    }
yy125:
	yych = *(q = ++p);
	if (yybm[0+yych] & 128) {
		goto yy129;
	}
	goto yy111;
yy126:
	yych = *++p;
	if (yych == ' ') goto yy126;
	{
      continue;
    }
yy129:
	yych = *++p;
	if (yybm[0+yych] & 128) {
		goto yy129;
	}
	if (yych == '}') goto yy132;
	p = q;
	goto yy111;
yy132:
	++p;
	{
      eval->AddSpecial(StringPiece(start + 2, p - start - 3));
      continue;
    }
}

  }
  last_token_ = start;
  ofs_ = p;
  if (path)
    EatWhitespace();
  // Non-path strings end in newlines, so there's no whitespace to eat.
  return true;
}